

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t sznet::detail::convertHex(char *buf,uintptr_t value)

{
  uint uVar1;
  char *__last;
  char *pcStack_28;
  int lsd;
  char *p;
  uintptr_t i;
  uintptr_t value_local;
  char *buf_local;
  
  pcStack_28 = buf;
  p = (char *)value;
  do {
    uVar1 = (uint)p;
    p = (char *)((ulong)p >> 4);
    __last = pcStack_28 + 1;
    *pcStack_28 = "0123456789ABCDEF"[(int)(uVar1 & 0xf)];
    pcStack_28 = __last;
  } while (p != (char *)0x0);
  *__last = '\0';
  std::reverse<char*>(buf,__last);
  return (long)__last - (long)buf;
}

Assistant:

size_t convertHex(char buf[], uintptr_t value)
	{
		uintptr_t i = value;
		char* p = buf;
		do
		{
			int lsd = static_cast<int>(i % 16);
			i /= 16;
			*p++ = digitsHex[lsd];
		} while (i != 0);
		*p = '\0';
		std::reverse(buf, p);
		return p - buf;
	}